

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionGraph.cpp
# Opt level: O0

void PrintGraph(ExpressionGraphContext *ctx,ExprBase *expression,char *name)

{
  InplaceStr local_30;
  char *local_20;
  char *name_local;
  ExprBase *expression_local;
  ExpressionGraphContext *ctx_local;
  
  local_20 = name;
  name_local = (char *)expression;
  expression_local = (ExprBase *)ctx;
  InplaceStr::InplaceStr(&local_30,name);
  PrintGraph(ctx,expression,local_30);
  OutputContext::Flush(*(OutputContext **)&expression_local->typeID);
  return;
}

Assistant:

void PrintGraph(ExpressionGraphContext &ctx, ExprBase *expression, const char *name)
{
	PrintGraph(ctx, expression, InplaceStr(name));

	ctx.output.Flush();
}